

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.cpp
# Opt level: O1

void pbrt::CheckCallbackScope::Fail(void)

{
  long lVar1;
  long lVar2;
  string message;
  long *local_68 [2];
  long local_58 [2];
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  
  PrintStackTrace();
  local_48 = local_38;
  local_40 = 0;
  local_38[0] = 0;
  if (DAT_02d58980 != callbacks_abi_cxx11_) {
    lVar2 = DAT_02d58980;
    do {
      if (*(long *)(lVar2 + -0x10) == 0) {
        std::__throw_bad_function_call();
      }
      lVar1 = lVar2 + -0x20;
      (**(code **)(lVar2 + -8))(local_68,lVar1);
      std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68[0]);
      if (local_68[0] != local_58) {
        operator_delete(local_68[0],local_58[0] + 1);
      }
      lVar2 = lVar1;
    } while (lVar1 != callbacks_abi_cxx11_);
  }
  fprintf(_stderr,"%s\n\n",local_48);
  abort();
}

Assistant:

void CheckCallbackScope::Fail() {
    PrintStackTrace();

    std::string message;
    for (auto iter = callbacks.rbegin(); iter != callbacks.rend(); ++iter)
        message += (*iter)();
    fprintf(stderr, "%s\n\n", message.c_str());

#if defined(_DEBUG) && defined(_MSC_VER)
    // When debugging on windows, avoid the obnoxious dialog and make
    // it possible to continue past a LOG(FATAL) in the debugger
    __debugbreak();
#else
    abort();
#endif
}